

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::Read
          (PosixMmapReadableFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  if (*(ulong *)(offset + 0x10) < (long)&result->data_ + n) {
    *(char **)scratch = "";
    scratch[8] = '\0';
    scratch[9] = '\0';
    scratch[10] = '\0';
    scratch[0xb] = '\0';
    scratch[0xc] = '\0';
    scratch[0xd] = '\0';
    scratch[0xe] = '\0';
    scratch[0xf] = '\0';
    PosixError((anon_unknown_1 *)this,(string *)(offset + 0x20),0x16);
  }
  else {
    *(size_t *)scratch = n + *(long *)(offset + 8);
    *(Slice **)(scratch + 8) = result;
    (this->super_RandomAccessFile)._vptr_RandomAccessFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    if (offset + n > length_) {
      *result = Slice();
      return PosixError(filename_, EINVAL);
    }

    *result = Slice(mmap_base_ + offset, n);
    return Status::OK();
  }